

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::MapKeySorter::MapKeyComparator::operator()
          (MapKeyComparator *this,MapKey *a,MapKey *b)

{
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  CppType CVar4;
  int32 iVar5;
  int32 iVar6;
  uint32 uVar7;
  uint32 uVar8;
  string *__lhs;
  string *__rhs;
  int64 iVar9;
  int64 iVar10;
  uint64 uVar11;
  uint64 uVar12;
  LogMessage *pLVar13;
  LogFinisher local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  MapKey *local_28;
  MapKey *b_local;
  MapKey *a_local;
  MapKeyComparator *this_local;
  
  local_28 = b;
  b_local = a;
  a_local = (MapKey *)this;
  CVar3 = MapKey::type(a);
  CVar4 = MapKey::type(local_28);
  local_61 = 0;
  if (CVar3 != CVar4) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x399);
    local_61 = 1;
    pLVar13 = LogMessage::operator<<(&local_60,"CHECK failed: a.type() == b.type(): ");
    LogFinisher::operator=(local_75,pLVar13);
  }
  if ((local_61 & 1) != 0) {
    LogMessage::~LogMessage(&local_60);
  }
  CVar3 = MapKey::type(b_local);
  switch(CVar3) {
  case CPPTYPE_INT32:
    iVar5 = MapKey::GetInt32Value(b_local);
    iVar6 = MapKey::GetInt32Value(local_28);
    this_local._7_1_ = iVar5 < iVar6;
    break;
  case CPPTYPE_INT64:
    iVar9 = MapKey::GetInt64Value(b_local);
    iVar10 = MapKey::GetInt64Value(local_28);
    this_local._7_1_ = iVar9 < iVar10;
    break;
  case CPPTYPE_UINT32:
    uVar7 = MapKey::GetUInt32Value(b_local);
    uVar8 = MapKey::GetUInt32Value(local_28);
    this_local._7_1_ = uVar7 < uVar8;
    break;
  case CPPTYPE_UINT64:
    uVar11 = MapKey::GetUInt64Value(b_local);
    uVar12 = MapKey::GetUInt64Value(local_28);
    this_local._7_1_ = uVar11 < uVar12;
    break;
  default:
    LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x3a8);
    pLVar13 = LogMessage::operator<<(&local_b0,"Invalid key for map field.");
    LogFinisher::operator=(&local_b1,pLVar13);
    LogMessage::~LogMessage(&local_b0);
    this_local._7_1_ = true;
    break;
  case CPPTYPE_BOOL:
    bVar1 = MapKey::GetBoolValue(b_local);
    bVar2 = MapKey::GetBoolValue(local_28);
    this_local._7_1_ = bVar1 < bVar2;
    break;
  case CPPTYPE_STRING:
    __lhs = MapKey::GetStringValue_abi_cxx11_(b_local);
    __rhs = MapKey::GetStringValue_abi_cxx11_(local_28);
    this_local._7_1_ = std::operator<(__lhs,__rhs);
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const MapKey& a, const MapKey& b) const {
      GOOGLE_DCHECK(a.type() == b.type());
      switch (a.type()) {
#define CASE_TYPE(CppType, CamelCppType)                                \
  case FieldDescriptor::CPPTYPE_##CppType: {                            \
    return a.Get##CamelCppType##Value() < b.Get##CamelCppType##Value(); \
  }
        CASE_TYPE(STRING, String)
        CASE_TYPE(INT64, Int64)
        CASE_TYPE(INT32, Int32)
        CASE_TYPE(UINT64, UInt64)
        CASE_TYPE(UINT32, UInt32)
        CASE_TYPE(BOOL, Bool)
#undef CASE_TYPE

        default:
          GOOGLE_LOG(DFATAL) << "Invalid key for map field.";
          return true;
      }
    }